

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data,double value)

{
  Message *pMVar1;
  SmallBuffer *ptr;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar1->data;
  }
  helics::SmallBuffer::reserve((SmallBuffer *)data,0x10);
  ((SmallBuffer *)data)->bufferSize = 0x10;
  helics::detail::convertToBinary(((SmallBuffer *)data)->heap,value);
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromDouble(HelicsDataBuffer data, double value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<double>::convert(value, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}